

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,string_view rhs,size_t compared_size,size_t size_to_compare)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference rVar4;
  anon_class_1_0_00000001 advance;
  ChunkIterator lhs_it;
  anon_class_1_0_00000001 local_f1;
  ulong local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  ChunkIterator local_c8;
  
  ChunkIterator::ChunkIterator(&local_c8,this);
  if (local_c8.bytes_remaining_ == 0) {
    rVar4 = (reference)ZEXT816(0);
  }
  else {
    rVar4 = ChunkIterator::operator*(&local_c8);
  }
  local_d8._M_len = rVar4._M_len - compared_size;
  if (compared_size <= rVar4._M_len) {
    local_e8._M_len = rhs._M_len - compared_size;
    if (rhs._M_len < compared_size) {
      __assert_fail("compared_size <= rhs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                    ,0x395,
                    "int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const");
    }
    local_d8._M_str = rVar4._M_str + compared_size;
    local_e8._M_str = rhs._M_str + compared_size;
    uVar3 = size_to_compare - compared_size;
    local_f0 = uVar3;
    while( true ) {
      bVar1 = CompareSlowPath::anon_class_1_0_00000001::operator()(&local_f1,&local_c8,&local_d8);
      if ((!bVar1) || (local_e8._M_len == 0)) {
        return (uint)(local_e8._M_len == 0) - (uint)(local_d8._M_len == 0);
      }
      uVar2 = anon_unknown_70::CompareChunks(&local_d8,&local_e8,&local_f0);
      uVar3 = uVar3 & 0xffffffff;
      if (local_f0 == 0) {
        uVar3 = 0;
      }
      if (uVar2 != 0) {
        uVar3 = (ulong)uVar2;
      }
      if (uVar2 != 0) break;
      if (local_f0 == 0) {
        return (int)uVar3;
      }
    }
    return (int)uVar3;
  }
  __assert_fail("compared_size <= lhs_chunk.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x394,"int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const");
}

Assistant:

inline int Cord::CompareSlowPath(absl::string_view rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();

  // compared_size is inside first chunk.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && !rhs.empty()) {
    int comparison_result = CompareChunks(&lhs_chunk, &rhs, &size_to_compare);
    if (comparison_result != 0) return comparison_result;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs.empty()) - static_cast<int>(lhs_chunk.empty());
}